

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *draw_list;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  ImGuiContext *pIVar6;
  undefined4 uVar7;
  char *pcVar8;
  bool *pbVar9;
  bool bVar10;
  bool bVar11;
  ImS8 IVar12;
  bool bVar13;
  short sVar14;
  ImU32 id;
  uint uVar15;
  int iVar16;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar17;
  size_t sVar18;
  char *pcVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ImGuiCol idx;
  long lVar23;
  ImGuiTabItem *pIVar24;
  undefined1 uVar25;
  uint uVar26;
  undefined7 uVar28;
  undefined8 uVar27;
  float fVar29;
  float fVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImVec2 IVar31;
  bool text_clipped;
  bool just_closed;
  ImGuiContext *local_b0;
  uint local_a4;
  ImGuiTextBuffer *local_a0;
  ImRect bb;
  bool hovered;
  undefined7 uStack_77;
  float fStack_74;
  bool held;
  float local_6c;
  undefined1 local_68 [24];
  char *local_50;
  uint local_44;
  int local_40;
  int local_3c;
  bool *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar6 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if (p_open != (bool *)0x0) {
    if (*p_open == false) {
      PushItemFlag(0x18,true);
      bb.Min.x = 0.0;
      bb.Min.y = 0.0;
      bb.Max.x = 0.0;
      bb.Max.y = 0.0;
      ItemAdd(&bb,id,(ImRect *)0x0);
      PopItemFlag();
      return false;
    }
    if (((uint)flags >> 0x15 & 1) != 0) {
      __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1d9c,
                    "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)")
      ;
    }
  }
  local_b0 = pIVar6;
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x1d9d,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  local_38 = (bool *)0x0;
  uVar26 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    uVar26 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    uVar26 = flags;
  }
  IVar3 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  fVar29 = IVar3.x;
  uVar15 = (tab_bar->Tabs).Size;
  local_68._8_4_ = extraout_XMM0_Dc;
  local_68._0_4_ = IVar3.x;
  local_68._4_4_ = IVar3.y;
  local_68._12_4_ = extraout_XMM0_Dd;
  local_50 = label;
  if (0 < (int)uVar15 && id != 0) {
    pIVar17 = (tab_bar->Tabs).Data;
    lVar23 = 0;
    do {
      if (*(ImU32 *)((long)&pIVar17->ID + lVar23) == id) {
        pIVar24 = (ImGuiTabItem *)((long)&pIVar17->ID + lVar23);
        bVar5 = 0;
        goto LAB_00165515;
      }
      lVar23 = lVar23 + 0x24;
    } while ((ulong)uVar15 * 0x24 != lVar23);
  }
  if (uVar15 == (tab_bar->Tabs).Capacity) {
    if (uVar15 == 0) {
      iVar20 = 8;
    }
    else {
      iVar20 = (int)uVar15 / 2 + uVar15;
    }
    iVar22 = uVar15 + 1;
    if ((int)(uVar15 + 1) < iVar20) {
      iVar22 = iVar20;
    }
    pIVar17 = (ImGuiTabItem *)MemAlloc((long)iVar22 * 0x24);
    pIVar24 = (tab_bar->Tabs).Data;
    if (pIVar24 != (ImGuiTabItem *)0x0) {
      memcpy(pIVar17,pIVar24,(long)(tab_bar->Tabs).Size * 0x24);
      MemFree((tab_bar->Tabs).Data);
    }
    (tab_bar->Tabs).Data = pIVar17;
    (tab_bar->Tabs).Capacity = iVar22;
    uVar15 = (tab_bar->Tabs).Size;
    fVar29 = (float)local_68._0_4_;
  }
  else {
    pIVar17 = (tab_bar->Tabs).Data;
  }
  pIVar17[(int)uVar15].ID = 0;
  pIVar17[(int)uVar15].Flags = 0;
  pIVar17[(int)uVar15].LastFrameVisible = -1;
  pIVar17[(int)uVar15].LastFrameSelected = -1;
  pIVar17[(int)uVar15].Offset = 0.0;
  pIVar17[(int)uVar15].Width = 0.0;
  pIVar17[(int)uVar15].ContentWidth = 0.0;
  pIVar17 = pIVar17 + (int)uVar15;
  pIVar17->NameOffset = -1;
  pIVar17->BeginOrder = -1;
  pIVar17->IndexDuringLayout = -1;
  pIVar17->WantClose = false;
  pIVar17->field_0x23 = 0;
  iVar20 = (tab_bar->Tabs).Size;
  uVar15 = iVar20 + 1;
  (tab_bar->Tabs).Size = uVar15;
  if (iVar20 < 0) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                  ,0x662,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
  }
  pIVar17 = (tab_bar->Tabs).Data;
  pIVar24 = pIVar17 + ((ulong)uVar15 - 1);
  pIVar24->ID = id;
  pIVar17[(ulong)uVar15 - 1].Width = fVar29;
  tab_bar->TabsAddedNew = true;
  bVar5 = 1;
LAB_00165515:
  pcVar8 = local_50;
  if ((pIVar24 < pIVar17) || (pIVar17 + (int)uVar15 <= pIVar24)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                  ,0x679,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar24 - (int)pIVar17) >> 2) * -0x71c7;
  pIVar24->ContentWidth = fVar29;
  sVar14 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar14 + 1;
  pIVar24->BeginOrder = sVar14;
  local_a4 = tab_bar->Flags;
  iVar16 = tab_bar->PrevFrameVisible + 1;
  iVar20 = local_b0->FrameCount;
  iVar21 = pIVar24->LastFrameVisible + 1;
  pIVar24->LastFrameVisible = iVar20;
  pIVar24->Flags = uVar26;
  local_a0 = &tab_bar->TabsNames;
  iVar22 = (tab_bar->TabsNames).Buf.Size;
  sVar14 = (short)iVar22 + -1;
  if (iVar22 == 0) {
    sVar14 = 0;
  }
  pIVar24->NameOffset = sVar14;
  sVar18 = strlen(local_50);
  ImGuiTextBuffer::append(local_a0,pcVar8,pcVar8 + sVar18 + 1);
  if (((iVar21 < iVar20) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar16 < iVar20) {
      if ((uVar26 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_0016560b;
    }
    else if ((uVar26 >> 0x15 & 1) == 0) {
LAB_0016560b:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((uVar26 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((uVar26 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  uVar28 = (undefined7)((ulong)pcVar8 >> 8);
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    uVar27 = CONCAT71(uVar28,1);
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar16 < iVar20) && ((tab_bar->Tabs).Size == 1)) {
    uVar27 = CONCAT71(uVar28,(tab_bar->Flags & 2) == 0);
  }
  else {
    uVar27 = 0;
  }
  if ((bool)((bVar5 | iVar20 <= iVar16) & iVar21 < iVar20)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return (bool)((uVar26 >> 0x15 & 1) == 0 & (byte)uVar27);
  }
  if (tab_bar->SelectedTabId == id) {
    pIVar24->LastFrameSelected = local_b0->FrameCount;
  }
  uVar15 = pIVar24->Flags;
  fVar29 = pIVar24->Width;
  fVar30 = pIVar24->Offset;
  if ((uVar15 & 0xc0) == 0) {
    fVar30 = (float)(int)(fVar30 - tab_bar->ScrollingAnim);
  }
  bb.Min.x = fVar30 + (tab_bar->BarRect).Min.x;
  IVar3 = (pIVar2->DC).CursorPos;
  bb.Min.y = (tab_bar->BarRect).Min.y + 0.0;
  IVar31.y = bb.Min.y;
  IVar31.x = bb.Min.x;
  (pIVar2->DC).CursorPos = IVar31;
  bb.Max.x = fVar29 + bb.Min.x;
  bb.Max.y = (float)local_68._4_4_ + bb.Min.y;
  local_68._0_4_ = uVar26;
  local_a0 = (ImGuiTextBuffer *)uVar27;
  local_40 = iVar21;
  local_3c = iVar20;
  if ((uVar15 & 0xc0) == 0) {
    fVar29 = tab_bar->ScrollingRectMinX;
    if ((fVar29 <= bb.Min.x) && (bb.Max.x <= tab_bar->ScrollingRectMaxX)) goto LAB_0016576b;
    fStack_74 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar29 <= bb.Min.x) & (uint)fVar29 |
                      (uint)bb.Min.x & -(uint)(fVar29 <= bb.Min.x));
    _held = tab_bar->ScrollingRectMaxX;
    local_6c = bb.Max.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
    bVar13 = true;
  }
  else {
LAB_0016576b:
    bVar13 = false;
  }
  pIVar6 = local_b0;
  _hovered = bb.Max.x - bb.Min.x;
  fStack_74 = bb.Max.y - bb.Min.y;
  IVar31 = (pIVar2->DC).CursorMaxPos;
  ItemSize((ImVec2 *)&hovered,(local_b0->Style).FramePadding.y);
  (pIVar2->DC).CursorMaxPos = IVar31;
  bVar10 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar10) {
    uVar25 = SUB81(local_a0,0);
    if (bVar13) {
      PopClipRect();
    }
    (pIVar2->DC).CursorPos = IVar3;
    return (bool)uVar25;
  }
  auVar4 = local_68._0_16_ & (undefined1  [16])0x200000;
  uVar26 = local_68._0_4_ & 0x200000;
  bVar10 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar26 >> 0x11) + (uint)pIVar6->DragDropActive * 0x200 + 0x1010);
  pbVar9 = local_38;
  if ((bVar10) && (auVar4 == (undefined1  [16])0x0)) {
    tab_bar->NextSelectedTabId = id;
  }
  hovered = (bool)(hovered | local_b0->HoveredId == id);
  local_44 = uVar26;
  if (local_b0->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if ((((held == true) && (local_3c <= local_40)) && (bVar11 = IsMouseDragging(0,-1.0), bVar11)) &&
     ((local_b0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar29 = (local_b0->IO).MouseDelta.x;
    if ((0.0 <= fVar29) ||
       (pIVar1 = &(local_b0->IO).MousePos, bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x)) {
      if ((fVar29 <= 0.0) || ((local_b0->IO).MousePos.x <= bb.Max.x)) goto LAB_00165981;
      IVar12 = '\x01';
    }
    else {
      IVar12 = -1;
    }
    if (tab_bar->ReorderRequestTabId != 0) {
      __assert_fail("tab_bar->ReorderRequestTabId == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x1cb8,
                    "void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)");
    }
    tab_bar->ReorderRequestTabId = pIVar24->ID;
    tab_bar->ReorderRequestDir = IVar12;
  }
LAB_00165981:
  draw_list = pIVar2->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if ((char)local_a0 == '\0') {
      idx = (uint)((local_a4 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((local_a4 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  local_a4 = CONCAT31(local_a4._1_3_,bVar10);
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,local_68._0_4_,col);
  RenderNavHighlight(&bb,id,1);
  bVar10 = IsItemHovered(8);
  if (bVar10) {
    bVar10 = IsMouseClicked(1,false);
    if (bVar10) {
      uVar26 = (uint)local_68._0_4_ >> 0x15 & 1;
    }
    else {
      bVar10 = IsMouseReleased(1);
      uVar26 = local_44;
      if (!bVar10) goto LAB_00165a4d;
    }
    if (uVar26 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_00165a4d:
  uVar26 = (uint)tab_bar->Flags >> 1 & 4 | local_68._0_4_;
  if (pbVar9 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar26,tab_bar->FramePadding,local_50,id,close_button_id,
             SUB81(local_a0,0),&just_closed,&text_clipped);
  if ((pbVar9 != (bool *)0x0) && (just_closed != false)) {
    *pbVar9 = false;
    TabBarCloseTab(tab_bar,pIVar24);
  }
  uVar7 = local_68._0_4_;
  if (bVar13) {
    PopClipRect();
  }
  (pIVar2->DC).CursorPos = IVar3;
  uVar25 = SUB81(local_a0,0);
  if ((((text_clipped == true) && (local_b0->HoveredId == id)) && (held == false)) &&
     (((local_b0->TooltipSlowDelay <= local_b0->HoveredIdNotActiveTimer &&
        local_b0->HoveredIdNotActiveTimer != local_b0->TooltipSlowDelay &&
       (bVar13 = IsItemHovered(0), pcVar8 = local_50, bVar13)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((pIVar24->Flags & 0x10) == 0)))))) {
    pcVar19 = FindRenderedTextEnd(local_50,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar19 - (int)pcVar8),pcVar8);
  }
  if ((((uint)uVar7 >> 0x15 & 1) != 0) &&
     (uVar25 = (undefined1)local_a4, tab_bar->SelectedTabId == pIVar24->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                  ,0x1e54,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return (bool)uVar25;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS16)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueReorder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}